

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.hpp
# Opt level: O2

void __thiscall
duckdb::ArrowType::ArrowType
          (ArrowType *this,LogicalType *type_p,
          unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
          *type_info)

{
  (this->extension_data).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->extension_data).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LogicalType::LogicalType(&this->type,type_p);
  (this->dictionary_type).
  super_unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
  super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl = (ArrowType *)0x0;
  this->run_end_encoded = false;
  (this->type_info).
  super_unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowTypeInfo_*,_std::default_delete<duckdb::ArrowTypeInfo>_>.
  super__Head_base<0UL,_duckdb::ArrowTypeInfo_*,_false>._M_head_impl =
       (type_info->
       super_unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowTypeInfo_*,_std::default_delete<duckdb::ArrowTypeInfo>_>.
       super__Head_base<0UL,_duckdb::ArrowTypeInfo_*,_false>._M_head_impl;
  (type_info->super_unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ArrowTypeInfo_*,_std::default_delete<duckdb::ArrowTypeInfo>_>.
  super__Head_base<0UL,_duckdb::ArrowTypeInfo_*,_false>._M_head_impl = (ArrowTypeInfo *)0x0;
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  this->not_implemented = false;
  return;
}

Assistant:

explicit ArrowType(LogicalType type_p, unique_ptr<ArrowTypeInfo> type_info = nullptr)
	    : type(std::move(type_p)), type_info(std::move(type_info)) {
	}